

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

int cm_zlib__tr_tally(deflate_state *s,uint dist,uint lc)

{
  uint uVar1;
  ct_data_s *pcVar2;
  
  uVar1 = s->sym_next;
  s->sym_next = uVar1 + 1;
  s->sym_buf[uVar1] = (uchf)dist;
  uVar1 = s->sym_next;
  s->sym_next = uVar1 + 1;
  s->sym_buf[uVar1] = (uchf)(dist >> 8);
  uVar1 = s->sym_next;
  s->sym_next = uVar1 + 1;
  s->sym_buf[uVar1] = (uchf)lc;
  if (dist == 0) {
    pcVar2 = s->dyn_ltree + lc;
  }
  else {
    s->matches = s->matches + 1;
    s->dyn_ltree[(ulong)""[lc] + 0x101].fc.freq = s->dyn_ltree[(ulong)""[lc] + 0x101].fc.freq + 1;
    uVar1 = (dist - 1 >> 7) + 0x100;
    if (dist < 0x101) {
      uVar1 = dist - 1;
    }
    pcVar2 = s->dyn_dtree + ""[uVar1];
  }
  (pcVar2->fc).freq = (pcVar2->fc).freq + 1;
  return (int)(s->sym_next == s->sym_end);
}

Assistant:

int ZLIB_INTERNAL _tr_tally (s, dist, lc)
    deflate_state *s;
    unsigned dist;  /* distance of matched string */
    unsigned lc;    /* match length-MIN_MATCH or unmatched char (if dist==0) */
{
    s->sym_buf[s->sym_next++] = dist;
    s->sym_buf[s->sym_next++] = dist >> 8;
    s->sym_buf[s->sym_next++] = lc;
    if (dist == 0) {
        /* lc is the unmatched char */
        s->dyn_ltree[lc].Freq++;
    } else {
        s->matches++;
        /* Here, lc is the match length - MIN_MATCH */
        dist--;             /* dist = match distance - 1 */
        Assert((ush)dist < (ush)MAX_DIST(s) &&
               (ush)lc <= (ush)(MAX_MATCH-MIN_MATCH) &&
               (ush)d_code(dist) < (ush)D_CODES,  "_tr_tally: bad match");

        s->dyn_ltree[_length_code[lc]+LITERALS+1].Freq++;
        s->dyn_dtree[d_code(dist)].Freq++;
    }
    return (s->sym_next == s->sym_end);
}